

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void thinning(Mat *im)

{
  int iVar1;
  Mat prev;
  Mat diff;
  _InputArray local_240;
  _OutputArray local_228;
  _InputArray local_210;
  undefined8 local_1f8;
  Mat local_1f0 [96];
  undefined4 local_190;
  undefined4 uStack_18c;
  Mat *local_188;
  undefined8 local_180 [12];
  Mat local_120 [96];
  Mat local_c0 [144];
  
  local_180[0] = 0;
  local_190 = 0x2010000;
  local_188 = im;
  cv::Mat::convertTo((_OutputArray *)im,(int)&local_190,0.00392156862745098,0.0);
  local_1f8 = CONCAT44((int)**(undefined8 **)(im + 0x40),
                       (int)((ulong)**(undefined8 **)(im + 0x40) >> 0x20));
  cv::Mat::zeros((Mat *)&local_190,&local_1f8,0);
  cv::Mat::Mat(local_1f0);
  (**(code **)(*(long *)CONCAT44(uStack_18c,local_190) + 0x18))
            ((long *)CONCAT44(uStack_18c,local_190),(Mat *)&local_190,local_1f0,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat((Mat *)local_180);
  cv::Mat::Mat((Mat *)&local_190);
  do {
    thinningIteration(im,0);
    thinningIteration(im,1);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x1010000;
    local_210.sz.width = 0;
    local_210.sz.height = 0;
    local_210.flags = 0x1010000;
    local_228.super__InputArray.sz.width = 0;
    local_228.super__InputArray.sz.height = 0;
    local_228.super__InputArray.flags = 0x2010000;
    local_240.obj = im;
    local_228.super__InputArray.obj = (Mat *)&local_190;
    local_210.obj = local_1f0;
    cv::absdiff(&local_240,&local_210,&local_228);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x2010000;
    local_240.obj = local_1f0;
    cv::Mat::copyTo((_OutputArray *)im);
    local_240.sz.width = 0;
    local_240.sz.height = 0;
    local_240.flags = 0x1010000;
    local_240.obj = (Mat *)&local_190;
    iVar1 = cv::countNonZero(&local_240);
  } while (0 < iVar1);
  local_240.sz.width = 0;
  local_240.sz.height = 0;
  local_240.flags = 0x2010000;
  local_240.obj = im;
  cv::Mat::convertTo((_OutputArray *)im,(int)&local_240,255.0,0.0);
  cv::Mat::~Mat((Mat *)&local_190);
  cv::Mat::~Mat(local_1f0);
  return;
}

Assistant:

void thinning(cv::Mat& im)
{
    im /= 255;
 
    cv::Mat prev = cv::Mat::zeros(im.size(), CV_8UC1);
    cv::Mat diff;
 
    do {
        thinningIteration(im, 0);
        thinningIteration(im, 1);
        cv::absdiff(im, prev, diff);
        im.copyTo(prev);
    } 
    while (cv::countNonZero(diff) > 0);
 
    im *= 255;
}